

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void check_consistency(char *filename,uint32 n_mgau,uint32 n_mgau_rd,uint32 n_stream,
                      uint32 n_stream_rd,uint32 n_density,uint32 n_density_rd,uint32 *veclen,
                      uint32 *veclen_rd)

{
  char *fmt;
  long lVar1;
  
  if (n_mgau == n_mgau_rd) {
    if (n_stream == n_stream_rd) {
      if (n_density == n_density_rd) {
        if (n_stream != 0) {
          lVar1 = 0;
          do {
            if (veclen[lVar1] != veclen_rd[lVar1]) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/map_adapt/main.c"
                      ,0x43,"Vector length of stream %u mismatched in %s\n",lVar1,filename);
              goto LAB_00103fcb;
            }
            lVar1 = lVar1 + 1;
          } while (n_stream != (uint32)lVar1);
        }
        return;
      }
      fmt = "Number of gaussians is mismatched in %s\n";
      lVar1 = 0x3f;
    }
    else {
      fmt = "Number of streams is mismatched in %s\n";
      lVar1 = 0x3d;
    }
  }
  else {
    fmt = "Number of codebooks is mismatched in %s\n";
    lVar1 = 0x3b;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/map_adapt/main.c"
          ,lVar1,fmt,filename);
LAB_00103fcb:
  exit(1);
}

Assistant:

static void
check_consistency(const char *filename,
		  uint32 n_mgau, uint32 n_mgau_rd,
		  uint32 n_stream, uint32 n_stream_rd,
		  uint32 n_density, uint32 n_density_rd,
		  const uint32 *veclen, 
		  const uint32 *veclen_rd)
{
    uint32 s;

    if (n_mgau != n_mgau_rd)
	E_FATAL("Number of codebooks is mismatched in %s\n",filename);
    if (n_stream != n_stream_rd)
	E_FATAL("Number of streams is mismatched in %s\n",filename);
    if (n_density != n_density_rd)
	E_FATAL("Number of gaussians is mismatched in %s\n",filename);
    for (s = 0; s < n_stream; ++s)
	if (veclen[s] != veclen_rd[s])
	    E_FATAL("Vector length of stream %u mismatched in %s\n",
		    s, filename);
}